

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

bool __thiscall sf::Font::loadFromFile(Font *this,string *filename)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_51;
  FT_Face_conflict face;
  FT_Stroker stroker;
  FT_Library library;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  cleanup(this,(EVP_PKEY_CTX *)filename);
  piVar2 = (int *)operator_new(4);
  *piVar2 = 1;
  this->m_refCount = piVar2;
  iVar1 = FT_Init_FreeType(&library);
  if (iVar1 == 0) {
    this->m_library = library;
    iVar1 = FT_New_Face(library,(filename->_M_dataplus)._M_p,0,&face);
    if (iVar1 == 0) {
      iVar1 = FT_Stroker_New(this->m_library,&stroker);
      if (iVar1 == 0) {
        iVar1 = FT_Select_Charmap(face,0x756e6963);
        if (iVar1 == 0) {
          this->m_stroker = stroker;
          this->m_face = face;
          if (face->family_name == (char *)0x0) {
            local_38 = local_28;
            local_30 = 0;
            local_28[0] = 0;
          }
          else {
            std::__cxx11::string::string((string *)&local_38,face->family_name,&local_51);
          }
          std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          return true;
        }
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,"Failed to load font \"");
        poVar3 = std::operator<<(poVar3,(string *)filename);
        poVar3 = std::operator<<(poVar3,"\" (failed to set the Unicode character set)");
        std::endl<char,std::char_traits<char>>(poVar3);
        FT_Stroker_Done(stroker);
      }
      else {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,"Failed to load font \"");
        poVar3 = std::operator<<(poVar3,(string *)filename);
        poVar3 = std::operator<<(poVar3,"\" (failed to create the stroker)");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      FT_Done_Face(face);
      return false;
    }
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,"Failed to load font \"");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    pcVar4 = "\" (failed to create the font face)";
  }
  else {
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,"Failed to load font \"");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    pcVar4 = "\" (failed to initialize FreeType)";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool Font::loadFromFile(const std::string& filename)
{
    #ifndef SFML_SYSTEM_ANDROID

    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Load the new font face from the specified file
    FT_Face face;
    if (FT_New_Face(static_cast<FT_Library>(m_library), filename.c_str(), 0, &face) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to create the font face)" << std::endl;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        return false;
    }

    // Select the unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to set the Unicode character set)" << std::endl;
        FT_Stroker_Done(stroker);
        FT_Done_Face(face);
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;

    #else

    if (m_stream)
        delete static_cast<priv::ResourceStream*>(m_stream);

    m_stream = new priv::ResourceStream(filename);
    return loadFromStream(*static_cast<priv::ResourceStream*>(m_stream));

    #endif
}